

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part_specifier.cpp
# Opt level: O2

bool duckdb::TryGetDatePartSpecifier(string *specifier_p,DatePartSpecifier *result)

{
  bool bVar1;
  DatePartSpecifier DVar2;
  string specifier;
  string sStack_38;
  
  StringUtil::Lower(&sStack_38,specifier_p);
  bVar1 = ::std::operator==(&sStack_38,"year");
  if (bVar1) {
LAB_0125d306:
    DVar2 = BEGIN_BIGINT;
  }
  else {
    bVar1 = ::std::operator==(&sStack_38,"yr");
    if (bVar1) goto LAB_0125d306;
    bVar1 = ::std::operator==(&sStack_38,"y");
    if (bVar1) goto LAB_0125d306;
    bVar1 = ::std::operator==(&sStack_38,"years");
    if (bVar1) goto LAB_0125d306;
    bVar1 = ::std::operator==(&sStack_38,"yrs");
    if (bVar1) goto LAB_0125d306;
    bVar1 = ::std::operator==(&sStack_38,"month");
    DVar2 = MONTH;
    if (!bVar1) {
      bVar1 = ::std::operator==(&sStack_38,"mon");
      if (!bVar1) {
        bVar1 = ::std::operator==(&sStack_38,"months");
        if (!bVar1) {
          bVar1 = ::std::operator==(&sStack_38,"mons");
          if (!bVar1) {
            bVar1 = ::std::operator==(&sStack_38,"day");
            DVar2 = DAY;
            if (!bVar1) {
              bVar1 = ::std::operator==(&sStack_38,"days");
              if (!bVar1) {
                bVar1 = ::std::operator==(&sStack_38,"d");
                if (!bVar1) {
                  bVar1 = ::std::operator==(&sStack_38,"dayofmonth");
                  if (!bVar1) {
                    bVar1 = ::std::operator==(&sStack_38,"decade");
                    DVar2 = DECADE;
                    if (!bVar1) {
                      bVar1 = ::std::operator==(&sStack_38,"dec");
                      if (!bVar1) {
                        bVar1 = ::std::operator==(&sStack_38,"decades");
                        if (!bVar1) {
                          bVar1 = ::std::operator==(&sStack_38,"decs");
                          if (!bVar1) {
                            bVar1 = ::std::operator==(&sStack_38,"century");
                            DVar2 = CENTURY;
                            if (!bVar1) {
                              bVar1 = ::std::operator==(&sStack_38,"cent");
                              if (!bVar1) {
                                bVar1 = ::std::operator==(&sStack_38,"centuries");
                                if (!bVar1) {
                                  bVar1 = ::std::operator==(&sStack_38,"c");
                                  if (!bVar1) {
                                    bVar1 = ::std::operator==(&sStack_38,"millennium");
                                    DVar2 = MILLENNIUM;
                                    if (!bVar1) {
                                      bVar1 = ::std::operator==(&sStack_38,"mil");
                                      if (!bVar1) {
                                        bVar1 = ::std::operator==(&sStack_38,"millenniums");
                                        if (!bVar1) {
                                          bVar1 = ::std::operator==(&sStack_38,"millennia");
                                          if (!bVar1) {
                                            bVar1 = ::std::operator==(&sStack_38,"mils");
                                            if (!bVar1) {
                                              bVar1 = ::std::operator==(&sStack_38,"millenium");
                                              if (!bVar1) {
                                                bVar1 = ::std::operator==(&sStack_38,"microseconds")
                                                ;
                                                DVar2 = MICROSECONDS;
                                                if (!bVar1) {
                                                  bVar1 = ::std::operator==(&sStack_38,"microsecond"
                                                                           );
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,"us");
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"usec");
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"usecs"
                                                                                 );
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,
                                                                                    "usecond");
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,
                                                                                      "useconds");
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                                                                                                                
                                                  "milliseconds");
                                                  DVar2 = MILLISECONDS;
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,
                                                                              "millisecond");
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"ms");
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"msec")
                                                        ;
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,
                                                                                    "msecs");
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,
                                                                                      "msecond");
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                        "mseconds");
                                                              if (!bVar1) {
                                                                bVar1 = ::std::operator==(&sStack_38
                                                                                          ,"second")
                                                                ;
                                                                DVar2 = SECOND;
                                                                if (!bVar1) {
                                                                  bVar1 = ::std::operator==(&
                                                  sStack_38,"sec");
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,"seconds");
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"secs");
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"s");
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,
                                                                                    "minute");
                                                          DVar2 = MINUTE;
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,
                                                                                      "min");
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                        "minutes");
                                                              if (!bVar1) {
                                                                bVar1 = ::std::operator==(&sStack_38
                                                                                          ,"mins");
                                                                if (!bVar1) {
                                                                  bVar1 = ::std::operator==(&
                                                  sStack_38,"m");
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,"hour");
                                                    DVar2 = HOUR;
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"hr");
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"hours"
                                                                                 );
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,"hrs"
                                                                                   );
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,"h"
                                                                                     );
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                        "epoch");
                                                              DVar2 = BEGIN_DOUBLE;
                                                              if (!bVar1) {
                                                                bVar1 = ::std::operator==(&sStack_38
                                                                                          ,"dow");
                                                                DVar2 = DOW;
                                                                if (!bVar1) {
                                                                  bVar1 = ::std::operator==(&
                                                  sStack_38,"dayofweek");
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,"weekday");
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"isodow")
                                                      ;
                                                      DVar2 = ISODOW;
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"week")
                                                        ;
                                                        DVar2 = WEEK;
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,
                                                                                    "weeks");
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,"w"
                                                                                     );
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                        "weekofyear"
                                                                                       );
                                                              if (!bVar1) {
                                                                bVar1 = ::std::operator==(&sStack_38
                                                                                          ,"doy");
                                                                DVar2 = DOY;
                                                                if (!bVar1) {
                                                                  bVar1 = ::std::operator==(&
                                                  sStack_38,"dayofyear");
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,"quarter");
                                                    DVar2 = QUARTER;
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,
                                                                                "quarters");
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,
                                                                                  "yearweek");
                                                        DVar2 = YEARWEEK;
                                                        if (!bVar1) {
                                                          bVar1 = ::std::operator==(&sStack_38,
                                                                                    "isoyear");
                                                          DVar2 = ISOYEAR;
                                                          if (!bVar1) {
                                                            bVar1 = ::std::operator==(&sStack_38,
                                                                                      "era");
                                                            DVar2 = ERA;
                                                            if (!bVar1) {
                                                              bVar1 = ::std::operator==(&sStack_38,
                                                                                        "timezone");
                                                              DVar2 = TIMEZONE;
                                                              if (!bVar1) {
                                                                bVar1 = ::std::operator==(&sStack_38
                                                                                          ,
                                                  "timezone_hour");
                                                  DVar2 = TIMEZONE_HOUR;
                                                  if (!bVar1) {
                                                    bVar1 = ::std::operator==(&sStack_38,
                                                                              "timezone_minute");
                                                    DVar2 = TIMEZONE_MINUTE;
                                                    if (!bVar1) {
                                                      bVar1 = ::std::operator==(&sStack_38,"julian")
                                                      ;
                                                      DVar2 = JULIAN_DAY;
                                                      if (!bVar1) {
                                                        bVar1 = ::std::operator==(&sStack_38,"jd");
                                                        if (!bVar1) {
                                                          bVar1 = false;
                                                          goto LAB_0125d30d;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *result = DVar2;
  bVar1 = true;
LAB_0125d30d:
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return bVar1;
}

Assistant:

bool TryGetDatePartSpecifier(const string &specifier_p, DatePartSpecifier &result) {
	auto specifier = StringUtil::Lower(specifier_p);
	if (specifier == "year" || specifier == "yr" || specifier == "y" || specifier == "years" || specifier == "yrs") {
		result = DatePartSpecifier::YEAR;
	} else if (specifier == "month" || specifier == "mon" || specifier == "months" || specifier == "mons") {
		result = DatePartSpecifier::MONTH;
	} else if (specifier == "day" || specifier == "days" || specifier == "d" || specifier == "dayofmonth") {
		result = DatePartSpecifier::DAY;
	} else if (specifier == "decade" || specifier == "dec" || specifier == "decades" || specifier == "decs") {
		result = DatePartSpecifier::DECADE;
	} else if (specifier == "century" || specifier == "cent" || specifier == "centuries" || specifier == "c") {
		result = DatePartSpecifier::CENTURY;
	} else if (specifier == "millennium" || specifier == "mil" || specifier == "millenniums" ||
	           specifier == "millennia" || specifier == "mils" || specifier == "millenium") {
		result = DatePartSpecifier::MILLENNIUM;
	} else if (specifier == "microseconds" || specifier == "microsecond" || specifier == "us" || specifier == "usec" ||
	           specifier == "usecs" || specifier == "usecond" || specifier == "useconds") {
		result = DatePartSpecifier::MICROSECONDS;
	} else if (specifier == "milliseconds" || specifier == "millisecond" || specifier == "ms" || specifier == "msec" ||
	           specifier == "msecs" || specifier == "msecond" || specifier == "mseconds") {
		result = DatePartSpecifier::MILLISECONDS;
	} else if (specifier == "second" || specifier == "sec" || specifier == "seconds" || specifier == "secs" ||
	           specifier == "s") {
		result = DatePartSpecifier::SECOND;
	} else if (specifier == "minute" || specifier == "min" || specifier == "minutes" || specifier == "mins" ||
	           specifier == "m") {
		result = DatePartSpecifier::MINUTE;
	} else if (specifier == "hour" || specifier == "hr" || specifier == "hours" || specifier == "hrs" ||
	           specifier == "h") {
		result = DatePartSpecifier::HOUR;
	} else if (specifier == "epoch") {
		// seconds since 1970-01-01
		result = DatePartSpecifier::EPOCH;
	} else if (specifier == "dow" || specifier == "dayofweek" || specifier == "weekday") {
		// day of the week (Sunday = 0, Saturday = 6)
		result = DatePartSpecifier::DOW;
	} else if (specifier == "isodow") {
		// isodow (Monday = 1, Sunday = 7)
		result = DatePartSpecifier::ISODOW;
	} else if (specifier == "week" || specifier == "weeks" || specifier == "w" || specifier == "weekofyear") {
		// ISO week number
		result = DatePartSpecifier::WEEK;
	} else if (specifier == "doy" || specifier == "dayofyear") {
		// day of the year (1-365/366)
		result = DatePartSpecifier::DOY;
	} else if (specifier == "quarter" || specifier == "quarters") {
		// quarter of the year (1-4)
		result = DatePartSpecifier::QUARTER;
	} else if (specifier == "yearweek") {
		// Combined isoyear and isoweek YYYYWW
		result = DatePartSpecifier::YEARWEEK;
	} else if (specifier == "isoyear") {
		// ISO year (first week of the year may be in previous year)
		result = DatePartSpecifier::ISOYEAR;
	} else if (specifier == "era") {
		result = DatePartSpecifier::ERA;
	} else if (specifier == "timezone") {
		result = DatePartSpecifier::TIMEZONE;
	} else if (specifier == "timezone_hour") {
		result = DatePartSpecifier::TIMEZONE_HOUR;
	} else if (specifier == "timezone_minute") {
		result = DatePartSpecifier::TIMEZONE_MINUTE;
	} else if (specifier == "julian" || specifier == "jd") {
		result = DatePartSpecifier::JULIAN_DAY;
	} else {
		return false;
	}
	return true;
}